

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretrain.cc
# Opt level: O2

void dynet::save_pretrained_embeddings(string *fname,Dict *d,LookupParameter *lp)

{
  ostream *poVar1;
  LookupParameterStorage *pLVar2;
  string *psVar3;
  invalid_argument *this;
  long lVar4;
  uint i;
  ulong uVar5;
  int local_3cc;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_3c8;
  ostringstream oss;
  ofstream out;
  byte abStack_210 [480];
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Writing word vectors to ");
  poVar1 = std::operator<<(poVar1,(string *)fname);
  std::operator<<(poVar1," ...\n");
  std::ofstream::ofstream(&out,(string *)fname,_S_out);
  if ((abStack_210[*(long *)(_out + -0x18)] & 5) == 0) {
    pLVar2 = LookupParameter::get_storage(lp);
    lVar4 = 0;
    for (uVar5 = 0;
        uVar5 < ((ulong)((long)(d->words_).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(d->words_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 5 & 0xffffffff);
        uVar5 = uVar5 + 1) {
      local_3cc = (int)uVar5;
      psVar3 = Dict::convert_abi_cxx11_(d,&local_3cc);
      poVar1 = std::operator<<((ostream *)&out,(string *)psVar3);
      poVar1 = std::operator<<(poVar1,' ');
      Tensor::operator*(&local_3c8,
                        (Tensor *)
                        ((long)(((pLVar2->values).
                                 super__Vector_base<dynet::Tensor,_std::allocator<dynet::Tensor>_>.
                                 _M_impl.super__Vector_impl_data._M_start)->d).d + lVar4));
      _oss = local_3c8.
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
             .
             super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data;
      poVar1 = Eigen::operator<<(poVar1,(DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                         *)&oss);
      std::endl<char,std::char_traits<char>>(poVar1);
      lVar4 = lVar4 + 0x40;
    }
    std::ofstream::~ofstream(&out);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  poVar1 = std::operator<<((ostream *)&oss,"Could not save embeddings to ");
  std::operator<<(poVar1,(string *)fname);
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this,(string *)&local_3c8);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void save_pretrained_embeddings(const std::string& fname,
    const Dict& d,
    const LookupParameter& lp) {
  cerr << "Writing word vectors to " << fname << " ...\n";
  ofstream out(fname);
  if(!out)
    DYNET_INVALID_ARG("Could not save embeddings to " << fname);
  auto& m = lp.get_storage();
  for (unsigned i = 0; i < d.size(); ++i) {
    out << d.convert(i) << ' ' << (*m.values[i]).transpose() << endl;
  }
}